

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spikeestimator.cxx
# Opt level: O2

int __thiscall SpikeEstimator::init(SpikeEstimator *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  double *pdVar2;
  uint i;
  ulong uVar3;
  
  this->initA = false;
  this->initB = false;
  (this->super_Estimator).nSamples = 0;
  this->spkALast = 0;
  this->spkBLast = 0;
  this->spkDiffAB = 0;
  this->spkDiffBA = 0;
  pdVar2 = this->spkSample;
  if (pdVar2 != (double *)0x0) {
    uVar1 = this->spkLength;
    for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      pdVar2[uVar3] = 0.0;
    }
  }
  this->spkOne = 0.0;
  return (int)pdVar2;
}

Assistant:

void SpikeEstimator::init()
{
    spkALast = 0;
    spkBLast = 0;
    spkDiffAB = 0;
    spkDiffBA = 0;
    initA = false;
    initB = false;

	nSamples = 0;
    if(spkSample)
        for(uint i=0; i<spkLength; i++)
            spkSample[i] = 0.0;
    spkOne = 0.0l;
}